

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O3

bool __thiscall mcsFile::OpenFile(mcsFile *this,string *fileName)

{
  char cVar1;
  ostream *poVar2;
  
  std::ifstream::open((char *)this,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"mcsFile: could not open input file ",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    this->line_num = 0;
  }
  return (bool)cVar1;
}

Assistant:

bool mcsFile::OpenFile(const std::string &fileName)
{
    file.open(fileName.c_str());
    if (!file.is_open()) {
        std::cerr << "mcsFile: could not open input file " << fileName << std::endl;
        return false;
    }
    line_num = 0;
    return true;
}